

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,int_declaration_t *d)

{
  system_t *this_00;
  intvar_id_t size_00;
  uint uVar1;
  uint uVar2;
  integer_t min;
  integer_t max;
  int initial;
  out_of_range *this_01;
  string *name;
  attributes_t *attributes;
  attributes_t local_60;
  intvar_id_t local_28;
  intvar_id_t size;
  int_declaration_t *local_18;
  int_declaration_t *d_local;
  system_builder_t *this_local;
  
  local_18 = d;
  d_local = (int_declaration_t *)this;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  uVar2 = parsing::int_declaration_t::size(local_18);
  if (uVar1 < uVar2) {
    this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_01,"integer variable size cannot be represented");
    __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  local_28 = parsing::int_declaration_t::size(local_18);
  this_00 = this->_system;
  name = parsing::int_declaration_t::name_abi_cxx11_(local_18);
  size_00 = local_28;
  min = parsing::int_declaration_t::min(local_18);
  max = parsing::int_declaration_t::max(local_18);
  initial = parsing::int_declaration_t::init(local_18,(EVP_PKEY_CTX *)d);
  attributes = parsing::declaration_t::attributes((declaration_t *)local_18);
  attributes_t::attributes_t(&local_60,attributes);
  system_t::add_intvar(this_00,name,size_00,min,max,initial,&local_60);
  attributes_t::~attributes_t(&local_60);
  return;
}

Assistant:

virtual void visit(tchecker::parsing::int_declaration_t const & d)
  {
    if (std::numeric_limits<tchecker::intvar_id_t>::max() < d.size())
      throw std::out_of_range("integer variable size cannot be represented");
    tchecker::intvar_id_t size = d.size();
    _system.add_intvar(d.name(), size, d.min(), d.max(), d.init(), d.attributes());
  }